

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_bool(PrintfArgFormatter<char> *this,bool value)

{
  FormatSpec *pFVar1;
  size_t in_RCX;
  void *__buf;
  byte in_SIL;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *in_RDI;
  bool in_stack_0000000f;
  FormatSpec *fmt_spec;
  
  pFVar1 = ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::spec(in_RDI);
  if (pFVar1->type_ == 's') {
    pFVar1->type_ = '\0';
    ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::write
              (in_RDI,(uint)(in_SIL & 1),__buf,in_RCX);
  }
  else {
    ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>::visit_any_int<bool>
              ((ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char> *)fmt_spec,
               in_stack_0000000f);
  }
  return;
}

Assistant:

void visit_bool(bool value) {
    FormatSpec &fmt_spec = this->spec();
    if (fmt_spec.type_ != 's')
      return this->visit_any_int(value);
    fmt_spec.type_ = 0;
    this->write(value);
  }